

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StringAggBind
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  int iVar3;
  reference pvVar4;
  pointer pEVar5;
  type expr;
  ParameterNotResolvedException *this_00;
  BinderException *this_01;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e8;
  LogicalType local_e0;
  Value local_c8;
  string separator_string;
  Value separator_val;
  
  if ((long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    make_uniq<duckdb::StringAggBindData,char_const(&)[2]>
              ((duckdb *)&separator_val,(char (*) [2])0x11593e2);
    *(undefined8 *)this = separator_val.type_._0_8_;
  }
  else {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    iVar3 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[6])(pEVar5);
    if ((char)iVar3 != '\0') {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    iVar3 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar5);
    if ((char)iVar3 == '\0') {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&separator_val,"Separator argument to StringAgg must be a constant",
                 (allocator *)&local_c8);
      BinderException::BinderException(this_01,(string *)&separator_val);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar4);
    ExpressionExecutor::EvaluateScalar(&separator_val,context,expr,false);
    ::std::__cxx11::string::string((string *)&separator_string,",",(allocator *)&local_c8);
    if (separator_val.is_null == true) {
      LogicalType::LogicalType(&local_e0,VARCHAR);
      Value::Value(&local_c8,&local_e0);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_e8,&local_c8);
      _Var2._M_head_impl = local_e8._M_head_impl;
      local_e8._M_head_impl = (Expression *)0x0;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      _Var1._M_head_impl =
           (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var1._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      }
      if (local_e8._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)local_e8._M_head_impl + 8))();
      }
      local_e8._M_head_impl = (Expression *)0x0;
      Value::~Value(&local_c8);
      LogicalType::~LogicalType(&local_e0);
    }
    else {
      Value::ToString_abi_cxx11_((string *)&local_c8,&separator_val);
      ::std::__cxx11::string::operator=((string *)&separator_string,(string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_c8);
    }
    Function::EraseArgument
              ((SimpleFunction *)function,arguments,
               ((long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) - 1);
    make_uniq<duckdb::StringAggBindData,std::__cxx11::string>((duckdb *)&local_c8,&separator_string)
    ;
    *(undefined8 *)this = local_c8.type_._0_8_;
    ::std::__cxx11::string::~string((string *)&separator_string);
    Value::~Value(&separator_val);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> StringAggBind(ClientContext &context, AggregateFunction &function,
                                       vector<unique_ptr<Expression>> &arguments) {
	if (arguments.size() == 1) {
		// single argument: default to comma
		return make_uniq<StringAggBindData>(",");
	}
	D_ASSERT(arguments.size() == 2);
	if (arguments[1]->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[1]->IsFoldable()) {
		throw BinderException("Separator argument to StringAgg must be a constant");
	}
	auto separator_val = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
	string separator_string = ",";
	if (separator_val.IsNull()) {
		arguments[0] = make_uniq<BoundConstantExpression>(Value(LogicalType::VARCHAR));
	} else {
		separator_string = separator_val.ToString();
	}
	Function::EraseArgument(function, arguments, arguments.size() - 1);
	return make_uniq<StringAggBindData>(std::move(separator_string));
}